

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTimer.h
# Opt level: O2

bool __thiscall
HighsTimer::reportOnTolerance
          (HighsTimer *this,char *grep_stamp,vector<int,_std::allocator<int>_> *clock_list,
          double ideal_sum_time,double tolerance_percent_report)

{
  int iVar1;
  pointer piVar2;
  pointer pdVar3;
  size_t in_RCX;
  int iVar4;
  undefined1 uVar5;
  uint uVar6;
  size_type __n;
  size_t i;
  size_type sVar7;
  double extraout_XMM0_Qa;
  double dVar8;
  double dVar9;
  double dVar10;
  vector<double,_std::allocator<double>_> percent_sum_clock_times;
  allocator_type local_81;
  char *local_80;
  double local_78;
  double local_70;
  double local_68;
  uint local_5c;
  double local_58;
  double local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  __n = (long)(clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start >> 2;
  local_80 = grep_stamp;
  local_78 = ideal_sum_time;
  local_68 = tolerance_percent_report;
  read(this,0,clock_list,in_RCX);
  dVar9 = 0.0;
  iVar4 = 0;
  local_70 = extraout_XMM0_Qa;
  for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
    uVar6 = (clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start[sVar7];
    if ((this->clock_start).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[(int)uVar6] <= 0.0) {
      printf("Clock %d - %s - still running\n",(ulong)uVar6,
             (this->clock_names).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(int)uVar6]._M_dataplus._M_p);
    }
    iVar4 = iVar4 + (this->clock_num_call).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)uVar6];
    dVar9 = dVar9 + (this->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[(int)uVar6];
  }
  uVar5 = 0;
  if ((iVar4 != 0) && (0.0 <= dVar9)) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,__n,&local_81);
    dVar10 = 0.0;
    piVar2 = (clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (this->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
      dVar8 = (pdVar3[piVar2[sVar7]] * 100.0) / dVar9;
      local_48._M_impl.super__Vector_impl_data._M_start[sVar7] = dVar8;
      if (dVar10 <= dVar8) {
        dVar10 = dVar8;
      }
    }
    uVar6 = (uint)(local_68 <= dVar10);
    if (local_68 <= dVar10) {
      local_5c = (uint)(local_68 <= dVar10);
      printf("\n%s-time  Operation                       :    Time     ( Total",local_80);
      if (0.0 < local_78) {
        printf(";  Ideal");
      }
      puts(";  Local):    Calls  Time/Call");
      dVar9 = 0.0;
      for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
        iVar4 = (clock_list->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[sVar7];
        dVar10 = (this->clock_time).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar4];
        iVar1 = (this->clock_num_call).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar4];
        if ((0 < iVar1) &&
           ((local_68 <= 0.0 ||
            (local_68 <= local_48._M_impl.super__Vector_impl_data._M_start[sVar7])))) {
          local_58 = dVar10 * 100.0;
          local_50 = dVar9;
          printf("%s-time  %-32s: %11.4e (%5.1f%%",dVar10,(dVar10 * 100.0) / local_70,local_80,
                 (this->clock_names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[iVar4]._M_dataplus._M_p);
          if (0.0 < local_78) {
            printf("; %5.1f%%",local_58 / local_78);
          }
          printf("; %5.1f%%):%9ld %11.4e\n",local_48._M_impl.super__Vector_impl_data._M_start[sVar7]
                 ,dVar10 / (double)iVar1,
                 (long)(this->clock_num_call).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar4]);
          dVar9 = local_50;
        }
        dVar9 = dVar9 + dVar10;
      }
      printf("%s-time  SUM                             : %11.4e (%5.1f%%",dVar9,
             (dVar9 * 100.0) / local_70,local_80);
      if (0.0 < local_78) {
        printf("; %5.1f%%",(dVar9 * 100.0) / local_78);
      }
      printf("; %5.1f%%)\n",0x4059000000000000);
      printf("%s-time  TOTAL                           : %11.4e\n",local_70,local_80);
      uVar6 = local_5c;
    }
    uVar5 = (undefined1)uVar6;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  }
  return (bool)uVar5;
}

Assistant:

bool reportOnTolerance(
      const char*
          grep_stamp,  //!< Character string used to extract output using grep
      std::vector<HighsInt>& clock_list,  //!< List of indices to report
      double ideal_sum_time = 0,          //!< Ideal value for times to sum to
      double tolerance_percent_report =
          0  //!< Lower bound on percentage of total time
             //!< before an individual clock is reported
  ) {
    size_t num_clock_list_entries = clock_list.size();
    double current_run_highs_time = read();
    bool non_null_report = false;

    // Check validity of the clock list and check no clocks are still
    // running, determine whether there are any times to report and
    // determine the total clock times
    HighsInt sum_calls = 0;
    double sum_clock_times = 0;
    for (size_t i = 0; i < num_clock_list_entries; i++) {
      HighsInt iClock = clock_list[i];
      assert(iClock >= 0);
      assert(iClock < num_clock);
      // Check that the clock's not still running. It should be set to
      // getWallTime() >= 0 (or initialised to initial_clock_start > 0)
      const bool clock_stopped = clock_start[iClock] > 0;
      if (!clock_stopped) {
        printf("Clock %d - %s - still running\n", int(iClock),
               clock_names[iClock].c_str());
      }
      assert(clock_stopped);
      sum_calls += clock_num_call[iClock];
      sum_clock_times += clock_time[iClock];
    }
    if (!sum_calls) return non_null_report;
    if (sum_clock_times < 0) return non_null_report;

    std::vector<double> percent_sum_clock_times(num_clock_list_entries);
    double max_percent_sum_clock_times = 0;
    for (size_t i = 0; i < num_clock_list_entries; i++) {
      HighsInt iClock = clock_list[i];
      percent_sum_clock_times[i] = 100.0 * clock_time[iClock] / sum_clock_times;
      max_percent_sum_clock_times =
          std::max(percent_sum_clock_times[i], max_percent_sum_clock_times);
    }
    if (max_percent_sum_clock_times < tolerance_percent_report)
      return non_null_report;

    non_null_report = true;

    // Report one line per clock, the time, number of calls and time per call
    printf("\n%s-time  Operation                       :    Time     ( Total",
           grep_stamp);
    if (ideal_sum_time > 0) printf(";  Ideal");
    printf(";  Local):    Calls  Time/Call\n");
    // Convert approximate seconds
    double sum_time = 0;
    for (size_t i = 0; i < num_clock_list_entries; i++) {
      HighsInt iClock = clock_list[i];
      double time = clock_time[iClock];
      double percent_run_highs = 100.0 * time / current_run_highs_time;
      double time_per_call = 0;
      if (clock_num_call[iClock] > 0) {
        time_per_call = time / clock_num_call[iClock];
        const bool report_time =
            tolerance_percent_report > 0
                ? percent_sum_clock_times[i] >= tolerance_percent_report
                : clock_num_call[iClock] > 0;
        if (report_time) {
          printf("%s-time  %-32s: %11.4e (%5.1f%%", grep_stamp,
                 clock_names[iClock].c_str(), time, percent_run_highs);
          if (ideal_sum_time > 0) {
            double percent_ideal = 100.0 * time / ideal_sum_time;
            printf("; %5.1f%%", percent_ideal);
          }
          printf("; %5.1f%%):%9ld %11.4e\n", percent_sum_clock_times[i],
                 static_cast<long int>(clock_num_call[iClock]), time_per_call);
        }
      }
      sum_time += time;
    }
    double percent_sum_clock_times_all = 100.0;
    assert(sum_time == sum_clock_times);
    double percent_run_highs = 100.0 * sum_time / current_run_highs_time;
    printf("%s-time  SUM                             : %11.4e (%5.1f%%",
           grep_stamp, sum_time, percent_run_highs);
    if (ideal_sum_time > 0) {
      double percent_ideal = 100.0 * sum_time / ideal_sum_time;
      printf("; %5.1f%%", percent_ideal);
    }
    printf("; %5.1f%%)\n", percent_sum_clock_times_all);
    printf("%s-time  TOTAL                           : %11.4e\n", grep_stamp,
           current_run_highs_time);
    return non_null_report;
  }